

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O0

void duckdb::TypeOfFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  reference this;
  Value *in_RDX;
  Value v;
  size_type in_stack_ffffffffffffff68;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffff70;
  string *psVar1;
  string local_78 [32];
  Value local_58 [64];
  Value *local_18;
  
  local_18 = in_RDX;
  this = vector<duckdb::Vector,_true>::operator[]
                   (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Vector::GetType(this);
  psVar1 = local_78;
  duckdb::LogicalType::ToString_abi_cxx11_();
  duckdb::Value::Value(local_58,psVar1);
  std::__cxx11::string::~string(local_78);
  duckdb::Vector::Reference(local_18);
  duckdb::Value::~Value(local_58);
  return;
}

Assistant:

static void TypeOfFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	Value v(args.data[0].GetType().ToString());
	result.Reference(v);
}